

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_cycler.cpp
# Opt level: O2

void __thiscall FCycler::FCycler(FCycler *this)

{
  this->m_cycle = 0.0;
  this->m_cycleType = CYCLE_Linear;
  this->m_current = 0.0;
  this->m_start = 0.0;
  this->m_end = 0.0;
  this->m_increment = true;
  this->m_shouldCycle = false;
  return;
}

Assistant:

FCycler::FCycler()
{
	m_cycle = 0.f;
	m_cycleType = CYCLE_Linear;
	m_shouldCycle = false;
	m_start = m_current = 0.f;
	m_end = 0.f;
	m_increment = true;
}